

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
          (void *this,Symbol *a,ParentNameQuery *b)

{
  SymbolBase *__n;
  bool bVar1;
  int iVar2;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_28;
  
  Symbol::parent_name_key(&local_28,(Symbol *)this);
  if (((SymbolBase *)local_28.first == a->ptr_) &&
     (__n = a[1].ptr_, (SymbolBase *)local_28.second._M_len == __n)) {
    if (__n != (SymbolBase *)0x0) {
      iVar2 = bcmp(local_28.second._M_str,a[2].ptr_,(size_t)__n);
      if (iVar2 != 0) goto LAB_00ef53ec;
    }
    bVar1 = true;
  }
  else {
LAB_00ef53ec:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.parent_name_key() == b.parent_name_key();
  }